

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O1

void __thiscall
cimod::BinaryPolynomialModel<unsigned_int,_double>::AddInteractionsFrom
          (BinaryPolynomialModel<unsigned_int,_double> *this,
          PolynomialKeyList<unsigned_int> *key_list,PolynomialValueList<double> *value_list,
          Vartype vartype)

{
  runtime_error *this_00;
  ulong uVar1;
  long lVar2;
  pointer pvVar3;
  long lVar4;
  
  if (((long)(key_list->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish -
       (long)(key_list->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
      ((long)(value_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(value_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3) == 0) {
    pvVar3 = (key_list->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((key_list->
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pvVar3) {
      lVar2 = 0;
      lVar4 = 0;
      uVar1 = 0;
      do {
        AddInteraction(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            ((long)&(pvVar3->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_start + lVar4),
                       (double *)
                       ((long)(value_list->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar2),vartype);
        uVar1 = uVar1 + 1;
        pvVar3 = (key_list->
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar4 = lVar4 + 0x18;
        lVar2 = lVar2 + 8;
      } while (uVar1 < (ulong)(((long)(key_list->
                                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >>
                               3) * -0x5555555555555555));
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"The sizes of key_list and value_list must match each other");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AddInteractionsFrom(
        PolynomialKeyList<IndexType> &key_list,
        const PolynomialValueList<FloatType> &value_list,
        const Vartype vartype = Vartype::NONE ) {
      if ( key_list.size() != value_list.size() ) {
        throw std::runtime_error( "The sizes of key_list and value_list must match each other" );
      }
      for ( std::size_t i = 0; i < key_list.size(); ++i ) {
        AddInteraction( key_list[ i ], value_list[ i ], vartype );
      }
    }